

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall
cs::instance_type::check_define_structured_binding(instance_type *this,iterator it,bool regist)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  int iVar3;
  token_base **pptVar4;
  runtime_error *prVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  size_t sVar8;
  undefined1 local_60 [32];
  domain_manager *local_40;
  iterator local_38;
  
  local_38.mData = it.mData;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_38);
  ptVar1 = *pptVar4;
  pp_Var6 = ptVar1[2]._vptr_token_base;
  pp_Var2 = ptVar1[4]._vptr_token_base;
  if (pp_Var6 != pp_Var2) {
    pp_Var7 = ptVar1[3]._vptr_token_base;
    sVar8 = ptVar1[3].line_num;
    local_40 = &(this->super_runtime_type).storage;
    do {
      local_60._0_8_ = *pp_Var6;
      pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      ptVar1 = *pptVar4;
      if (ptVar1 == (token_base *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Wrong grammar for variable definition(7).","");
        runtime_error::runtime_error(prVar5,(string *)local_60);
        __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar3 == 4) {
        if (regist) {
          domain_manager::add_record(local_40,(string *)(ptVar1 + 3));
        }
      }
      else {
        iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
        if (iVar3 != 0xf) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_60._0_8_ = local_60 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Wrong grammar for variable definition(8).","");
          runtime_error::runtime_error(prVar5,(string *)local_60);
          __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        check_define_structured_binding(this,(tree_node *)*pp_Var6,regist);
      }
      pp_Var6 = pp_Var6 + 1;
      if (pp_Var6 == pp_Var7) {
        pp_Var6 = *(_func_int ***)(sVar8 + 8);
        sVar8 = sVar8 + 8;
        pp_Var7 = pp_Var6 + 0x40;
      }
    } while (pp_Var6 != pp_Var2);
  }
  return;
}

Assistant:

void
	instance_type::check_define_structured_binding(tree_type<token_base *>::iterator it, bool regist)
	{
		for (auto &p_it: static_cast<token_parallel *>(it.data())->get_parallel()) {
			token_base *root = p_it.root().data();
			if (root == nullptr)
				throw runtime_error("Wrong grammar for variable definition(7).");
			if (root->get_type() != token_types::id) {
				if (root->get_type() == token_types::parallel)
					check_define_structured_binding(p_it.root(), regist);
				else
					throw runtime_error("Wrong grammar for variable definition(8).");
			}
			else if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}